

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_us * stbi_load_16(char *filename,int *x,int *y,int *comp,int req_comp)

{
  FILE *__stream;
  stbi__uint16 *result;
  FILE *f;
  int in_stack_00000094;
  int *in_stack_00000098;
  int *in_stack_000000a0;
  int *in_stack_000000a8;
  FILE *in_stack_000000b0;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  stbi__uint16 *local_8;
  
  __stream = (FILE *)stbi__fopen(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (__stream == (FILE *)0x0) {
    stbi__err("Unable to open file");
    local_8 = (stbi__uint16 *)0x0;
  }
  else {
    local_8 = stbi_load_from_file_16
                        (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
                         in_stack_00000094);
    fclose(__stream);
  }
  return local_8;
}

Assistant:

STBIDEF stbi_us *stbi_load_16(char const *filename, int *x, int *y, int *comp, int req_comp)
{
   FILE *f = stbi__fopen(filename, "rb");
   stbi__uint16 *result;
   if (!f) return (stbi_us *) stbi__errpuc("can't fopen", "Unable to open file");
   result = stbi_load_from_file_16(f,x,y,comp,req_comp);
   fclose(f);
   return result;
}